

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

void __thiscall
Diligent::DearchiverBase::UnpackRenderPass
          (DearchiverBase *this,RenderPassUnpackInfo *UnpackInfo,IRenderPass **ppRP)

{
  bool bVar1;
  ArchiveData *pAVar2;
  IMemoryAllocator *Allocator;
  char (*in_RCX) [30];
  RPData RP;
  
  *ppRP = (IRenderPass *)0x0;
  if (UnpackInfo->pDevice == (IRenderDevice *)0x0) {
    FormatString<char[26],char[30]>
              ((string *)&RP,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"UnpackInfo.pDevice != nullptr",in_RCX);
    in_RCX = (char (*) [30])0x33e;
    DebugAssertionFailed
              ((Char *)RP.Allocator.m_Blocks.
                       super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                       ._M_impl.super__Vector_impl_data._M_start,"UnpackRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x33e);
    std::__cxx11::string::~string((string *)&RP);
  }
  if ((UnpackInfo->ModifyRenderPassDesc == (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) &&
     (in_RCX = (char (*) [30])ppRP,
     bVar1 = NamedResourceCache<Diligent::IRenderPass>::Get
                       (&(this->m_Cache).RenderPass,RenderPass,UnpackInfo->Name,ppRP), bVar1)) {
    return;
  }
  pAVar2 = FindArchive(this,RenderPass,UnpackInfo->Name);
  if (pAVar2 != (ArchiveData *)0x0) {
    if ((pAVar2->pObjArchive)._M_t.
        super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
        .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>._M_head_impl ==
        (DeviceObjectArchive *)0x0) {
      FormatString<char[26],char[12]>
                ((string *)&RP,(Diligent *)"Debug expression failed:\n",(char (*) [26])"pObjArchive"
                 ,(char (*) [12])in_RCX);
      DebugAssertionFailed
                ((Char *)RP.Allocator.m_Blocks.
                         super__Vector_base<Diligent::DynamicLinearAllocator::Block,_std::allocator<Diligent::DynamicLinearAllocator::Block>_>
                         ._M_impl.super__Vector_impl_data._M_start,"UnpackRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
                 ,0x34e);
      std::__cxx11::string::~string((string *)&RP);
    }
    Allocator = GetRawAllocator();
    RPData::RPData(&RP,Allocator,0x400);
    bVar1 = DeviceObjectArchive::LoadResourceCommonData<Diligent::DearchiverBase::RPData>
                      ((pAVar2->pObjArchive)._M_t.
                       super___uniq_ptr_impl<const_Diligent::DeviceObjectArchive,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_const_Diligent::DeviceObjectArchive_*,_std::default_delete<const_Diligent::DeviceObjectArchive>_>
                       .super__Head_base<0UL,_const_Diligent::DeviceObjectArchive_*,_false>.
                       _M_head_impl,RenderPass,UnpackInfo->Name,&RP);
    if (bVar1) {
      if (UnpackInfo->ModifyRenderPassDesc != (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) {
        (*UnpackInfo->ModifyRenderPassDesc)(&RP.Desc,UnpackInfo->pUserData);
      }
      (*(UnpackInfo->pDevice->super_IObject)._vptr_IObject[0xf])(UnpackInfo->pDevice,&RP.Desc,ppRP);
      if (UnpackInfo->ModifyRenderPassDesc == (_func_void_RenderPassDesc_ptr_void_ptr *)0x0) {
        NamedResourceCache<Diligent::IRenderPass>::Set
                  (&(this->m_Cache).RenderPass,RenderPass,UnpackInfo->Name,*ppRP);
      }
    }
    DynamicLinearAllocator::~DynamicLinearAllocator(&RP.Allocator);
  }
  return;
}

Assistant:

void DearchiverBase::UnpackRenderPass(const RenderPassUnpackInfo& UnpackInfo, IRenderPass** ppRP)
{
    if (!VerifyRenderPassUnpackInfo(UnpackInfo, ppRP))
        return;

    *ppRP = nullptr;

    VERIFY_EXPR(UnpackInfo.pDevice != nullptr);
    // Do not cache modified render passes.
    if (UnpackInfo.ModifyRenderPassDesc == nullptr)
    {
        // Since render pass names must be unique, we use a single cache for all
        // loaded archives.
        if (m_Cache.RenderPass.Get(RPData::ArchiveResType, UnpackInfo.Name, ppRP))
            return;
    }

    // Find the archive that contains this render pass.
    ArchiveData* pArchiveData = FindArchive(RPData::ArchiveResType, UnpackInfo.Name);
    if (pArchiveData == nullptr)
        return;

    const auto& pObjArchive = pArchiveData->pObjArchive;
    VERIFY_EXPR(pObjArchive);

    RPData RP{GetRawAllocator()};
    if (!pArchiveData->pObjArchive->LoadResourceCommonData(RPData::ArchiveResType, UnpackInfo.Name, RP))
        return;

    if (UnpackInfo.ModifyRenderPassDesc != nullptr)
        UnpackInfo.ModifyRenderPassDesc(RP.Desc, UnpackInfo.pUserData);

    UnpackInfo.pDevice->CreateRenderPass(RP.Desc, ppRP);

    if (UnpackInfo.ModifyRenderPassDesc == nullptr)
        m_Cache.RenderPass.Set(RPData::ArchiveResType, UnpackInfo.Name, *ppRP);
}